

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

bool gl4cts::CopyImage::Utils::roundComponent
               (GLenum internal_format,GLenum component,GLdouble *value)

{
  __type _Var1;
  double dVar2;
  undefined4 local_30;
  undefined4 local_2c;
  int multiplier;
  int rounded_value;
  int exponent;
  GLdouble *value_local;
  GLenum component_local;
  GLenum internal_format_local;
  
  if (internal_format == 0x804f) {
    local_30 = 4;
  }
  else {
    local_30 = 0;
    if (internal_format == 0x8050) {
      local_30 = 5;
    }
  }
  if (local_30 == 0) {
    component_local._3_1_ = false;
  }
  else {
    _Var1 = std::pow<int,int>(2,local_30);
    dVar2 = floor((_Var1 - 1.0) * *value + 0.5);
    local_2c = 1;
    if (component == 0x1904) {
      local_2c = 2;
    }
    if (internal_format == 0x804f) {
      local_2c = local_2c << 1;
    }
    *value = (double)((int)dVar2 * local_2c);
    component_local._3_1_ = true;
  }
  return component_local._3_1_;
}

Assistant:

inline bool Utils::roundComponent(GLenum internal_format, GLenum component, GLdouble& value)
{
	int exponent = (internal_format == GL_RGB4 ? 4 : (internal_format == GL_RGB5 ? 5 : 0));
	if (!exponent)
		return false; //Currently this only happens with GL_RGB4 and GL_RGB5 when stored as 565 type.

	int rounded_value = static_cast<int>(floor((pow(2, exponent) - 1) * value + 0.5));
	int multiplier	= (component == GL_GREEN ? 2 : 1);
	if (internal_format == GL_RGB4)
	{
		multiplier *= 2;
	}
	value = rounded_value * multiplier;
	return true;
}